

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_loader.cpp
# Opt level: O1

ze_result_t __thiscall
loader::context_t::check_drivers
          (context_t *this,ze_init_flags_t flags,ze_init_driver_type_desc_t *desc,
          ze_global_dditable_t *globalInitStored,zes_global_dditable_t *sysmanGlobalInitStored,
          bool *requireDdiReinit,bool sysmanOnly)

{
  ulong uVar1;
  driver_vector_t *this_00;
  int iVar2;
  ze_result_t zVar3;
  long *plVar4;
  undefined8 *puVar5;
  char *pcVar6;
  iterator iVar7;
  ulong *puVar8;
  long *plVar9;
  ze_result_t result;
  ulong uVar10;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  iterator __position;
  bool bVar13;
  bool bVar14;
  string initName;
  string errorMessage;
  string freeLibraryErrorValue;
  long *local_238;
  char *local_230;
  long local_228;
  long lStack_220;
  ulong *local_218;
  ze_init_driver_type_desc_t *local_210;
  ulong local_208;
  long lStack_200;
  ulong *local_1f8;
  undefined8 local_1f0;
  ulong local_1e8;
  undefined8 uStack_1e0;
  string local_1d8;
  undefined4 local_1b4;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  ze_init_flags_t local_18c;
  ze_result_t local_188;
  uint local_184;
  driver_vector_t *local_180;
  string local_178;
  bool *local_158;
  long local_150;
  ze_global_dditable_t *local_148;
  zes_global_dditable_t *local_140;
  pointer local_138;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_18c = flags;
  local_158 = requireDdiReinit;
  local_148 = globalInitStored;
  local_140 = sysmanGlobalInitStored;
  if (this->debugTraceEnabled != true) goto LAB_0018032d;
  local_1b0 = &local_1a0;
  if (desc == (ze_init_driver_type_desc_t *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"flags=","");
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x1cd966);
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_208 = *puVar8;
      lStack_200 = plVar4[3];
      local_218 = &local_208;
    }
    else {
      local_208 = *puVar8;
      local_218 = (ulong *)*plVar4;
    }
    local_210 = (ze_init_driver_type_desc_t *)plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    to_string_abi_cxx11_(&local_1d8,(loader *)(ulong)local_18c,(ze_init_flags_t)local_210);
    uVar1 = (long)&local_210->stype + local_1d8._M_string_length;
    uVar10 = 0xf;
    if (local_218 != &local_208) {
      uVar10 = local_208;
    }
    if (uVar10 < uVar1) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        uVar11 = local_1d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < uVar1) goto LAB_00180144;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_218);
    }
    else {
LAB_00180144:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1d8._M_dataplus._M_p)
      ;
    }
    local_1f8 = &local_1e8;
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_1e8 = *puVar8;
      uStack_1e0 = puVar5[3];
    }
    else {
      local_1e8 = *puVar8;
      local_1f8 = (ulong *)*puVar5;
    }
    local_1f0 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f8);
    local_238 = &local_228;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_228 = *plVar4;
      lStack_220 = puVar5[3];
    }
    else {
      local_228 = *plVar4;
      local_238 = (long *)*puVar5;
    }
    local_230 = (char *)puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,local_1a0 + 1);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_238,local_230 + (long)local_238);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
    debug_trace_message(this,&local_90,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    _Var12._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_0018030e;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"desc->flags=","");
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x1cd966);
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_208 = *puVar8;
      lStack_200 = plVar4[3];
      local_218 = &local_208;
    }
    else {
      local_208 = *puVar8;
      local_218 = (ulong *)*plVar4;
    }
    local_210 = (ze_init_driver_type_desc_t *)plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    to_string_abi_cxx11_(&local_1d8,(loader *)desc,local_210);
    uVar1 = (long)&local_210->stype + local_1d8._M_string_length;
    uVar10 = 0xf;
    if (local_218 != &local_208) {
      uVar10 = local_208;
    }
    if (uVar10 < uVar1) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        uVar11 = local_1d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < uVar1) goto LAB_0017fef4;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_218);
    }
    else {
LAB_0017fef4:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1d8._M_dataplus._M_p)
      ;
    }
    local_1f8 = &local_1e8;
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_1e8 = *puVar8;
      uStack_1e0 = puVar5[3];
    }
    else {
      local_1e8 = *puVar8;
      local_1f8 = (ulong *)*puVar5;
    }
    local_1f0 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f8);
    local_238 = &local_228;
    plVar9 = plVar4 + 2;
    if ((long *)*plVar4 == plVar9) {
      local_228 = *plVar9;
      lStack_220 = plVar4[3];
    }
    else {
      local_228 = *plVar9;
      local_238 = (long *)*plVar4;
    }
    local_230 = (char *)plVar4[1];
    *plVar4 = (long)plVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,local_1a0 + 1);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_238,local_230 + (long)local_238);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    debug_trace_message(this,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_90.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
    _Var12._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_0018030e:
      operator_delete(_Var12._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
LAB_0018032d:
  if ((desc == (ze_init_driver_type_desc_t *)0x0) || (*(char *)(context + 0x162a) != '\0')) {
    local_238 = &local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"zeInit","");
    if (desc != (ze_init_driver_type_desc_t *)0x0) {
      std::__cxx11::string::_M_replace((ulong)&local_238,0,local_230,0x1cd9db);
    }
    if (sysmanOnly) {
      std::__cxx11::string::_M_replace((ulong)&local_238,0,local_230,0x1cd9e9);
      local_180 = &this->zesDrivers;
    }
    else {
      local_180 = &this->zeDrivers;
    }
    iVar7._M_current =
         (local_180->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>).
         _M_impl.super__Vector_impl_data._M_start;
    local_150 = (long)(local_180->
                      super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)iVar7._M_current;
    bVar13 = local_150 != 0xd98;
    pcVar6 = getenv("ZE_ENABLE_PCI_ID_DEVICE_ORDER");
    if ((pcVar6 == (char *)0x0) || (iVar2 = strcmp("0",pcVar6), iVar2 == 0)) {
      local_1b4 = 0;
    }
    else {
      iVar2 = strcmp("1",pcVar6);
      local_1b4 = CONCAT31((int3)((uint)iVar2 >> 8),iVar2 == 0);
    }
    pcVar6 = getenv("ZET_ENABLE_PROGRAM_INSTRUMENTATION");
    if ((pcVar6 == (char *)0x0) || (iVar2 = strcmp("0",pcVar6), iVar2 == 0)) {
      bVar14 = false;
    }
    else {
      iVar2 = strcmp("1",pcVar6);
      bVar14 = iVar2 == 0;
    }
    *(bool *)(context + 0x165d) = bVar14;
    local_184 = (uint)sysmanOnly;
    do {
      __position._M_current = iVar7._M_current;
      this_00 = local_180;
      local_138 = (local_180->
                  super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      if (__position._M_current == local_138) break;
      (__position._M_current)->pciOrderingRequested = SUB41(local_1b4,0);
      local_1f8 = &local_1e8;
      local_1f0 = 0;
      local_1e8 = local_1e8 & 0xffffffffffffff00;
      zVar3 = init_driver(this,__position._M_current,local_18c,desc,local_148,local_140,
                          SUB41(local_184,0));
      if (zVar3 == ZE_RESULT_SUCCESS) {
        (__position._M_current)->driverInuse = true;
        iVar7._M_current = __position._M_current + 1;
        bVar14 = true;
      }
      else {
        if (((__position._M_current)->driverInuse == false) && (*(char *)(context + 0x162a) == '\0')
           ) {
          if (this->debugTraceEnabled == true) {
            std::operator+(&local_110,"Check Drivers Failed on ",&(__position._M_current)->name);
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
            puVar8 = (ulong *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar8) {
              local_1d8.field_2._M_allocated_capacity = *puVar8;
              local_1d8.field_2._8_8_ = plVar4[3];
            }
            else {
              local_1d8.field_2._M_allocated_capacity = *puVar8;
              local_1d8._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_1d8._M_string_length = plVar4[1];
            *plVar4 = (long)puVar8;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_238);
            plVar9 = plVar4 + 2;
            if ((long *)*plVar4 == plVar9) {
              local_1a0 = *plVar9;
              lStack_198 = plVar4[3];
              local_1b0 = &local_1a0;
            }
            else {
              local_1a0 = *plVar9;
              local_1b0 = (long *)*plVar4;
            }
            local_1a8 = plVar4[1];
            *plVar4 = (long)plVar9;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b0);
            local_218 = &local_208;
            puVar8 = (ulong *)(plVar4 + 2);
            if ((ulong *)*plVar4 == puVar8) {
              local_208 = *puVar8;
              lStack_200 = plVar4[3];
            }
            else {
              local_208 = *puVar8;
              local_218 = (ulong *)*plVar4;
            }
            local_210 = (ze_init_driver_type_desc_t *)plVar4[1];
            *plVar4 = (long)puVar8;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            if (local_1b0 != &local_1a0) {
              operator_delete(local_1b0,local_1a0 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_178,local_218,(long)&local_210->stype + (long)local_218);
            to_string_abi_cxx11_(&local_130,(loader *)(ulong)zVar3,result);
            debug_trace_message(this,&local_178,&local_130);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_218 != &local_208) {
              operator_delete(local_218,local_208 + 1);
            }
          }
          iVar7 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::_M_erase
                            (this_00,__position);
          if (((long)(this_00->
                     super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this_00->
                     super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>).
                     _M_impl.super__Vector_impl_data._M_start == 0xd98) &&
             (*(char *)(context + 0x1629) == '\0')) {
            *local_158 = true;
          }
        }
        else {
          iVar7._M_current = __position._M_current + 1;
        }
        bVar14 = bVar13;
        if (local_150 == 0xd98) {
          local_188 = zVar3;
        }
      }
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,local_1e8 + 1);
      }
    } while (bVar14);
    zVar3 = local_188;
    if ((__position._M_current == local_138) &&
       (zVar3 = ZE_RESULT_ERROR_UNINITIALIZED,
       (local_180->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>)._M_impl.
       super__Vector_impl_data._M_finish !=
       (local_180->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>)._M_impl.
       super__Vector_impl_data._M_start)) {
      zVar3 = ZE_RESULT_SUCCESS;
    }
    if (local_238 == &local_228) {
      return zVar3;
    }
  }
  else {
    if (this->debugTraceEnabled != true) {
      return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    local_238 = &local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "zeInitDrivers called first, but not supported by driver, returning uninitialized.",
               "");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_238,local_230 + (long)local_238);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
    debug_trace_message(this,&local_d0,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    zVar3 = ZE_RESULT_ERROR_UNINITIALIZED;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (local_238 == &local_228) {
      return ZE_RESULT_ERROR_UNINITIALIZED;
    }
  }
  operator_delete(local_238,local_228 + 1);
  return zVar3;
}

Assistant:

ze_result_t context_t::check_drivers(ze_init_flags_t flags, ze_init_driver_type_desc_t* desc, ze_global_dditable_t *globalInitStored, zes_global_dditable_t *sysmanGlobalInitStored, bool *requireDdiReinit, bool sysmanOnly) {
        if (debugTraceEnabled) {
            if (desc) {
                std::string message = "check_drivers(" + std::string("desc->flags=") + loader::to_string(desc) + ")";
                debug_trace_message(message, "");
            } else {
                std::string message = "check_drivers(" + std::string("flags=") + loader::to_string(flags) + ")";
                debug_trace_message(message, "");
            }
        }
        // If zeInitDrivers is not supported by this driver, but zeInitDrivers is called first, then return uninitialized.
        if (desc && !loader::context->initDriversSupport) {
            if (debugTraceEnabled) {
                std::string message = "zeInitDrivers called first, but not supported by driver, returning uninitialized.";
                debug_trace_message(message, "");
            }
            return ZE_RESULT_ERROR_UNINITIALIZED;
        }


        bool return_first_driver_result=false;
        std::string initName = "zeInit";
        driver_vector_t *drivers = &zeDrivers;
        // If desc is set, then this is zeInitDrivers.
        if (desc) {
            initName = "zeInitDrivers";
        }
        // If this is sysmanOnly check_drivers, then zesInit is being called and we need to use zesDrivers.
        if (sysmanOnly) {
            drivers = &zesDrivers;
            initName = "zesInit";
        }
        if(drivers->size()==1) {
            return_first_driver_result=true;
        }
        bool pciOrderingRequested = getenv_tobool( "ZE_ENABLE_PCI_ID_DEVICE_ORDER" );
        loader::context->instrumentationEnabled = getenv_tobool( "ZET_ENABLE_PROGRAM_INSTRUMENTATION" );

        for(auto it = drivers->begin(); it != drivers->end(); )
        {
            it->pciOrderingRequested = pciOrderingRequested;
            std::string freeLibraryErrorValue;
            ze_result_t result = init_driver(*it, flags, desc, globalInitStored, sysmanGlobalInitStored, sysmanOnly);
            if(result != ZE_RESULT_SUCCESS) {
                // If the driver has already been init and handles are to be read, then this driver cannot be removed from the list.
                // Also, if any driver supports zeInitDrivers, then no driver can be removed to allow for different sets of drivers.
                if (!it->driverInuse && !loader::context->initDriversSupport) {
                    if (debugTraceEnabled) {
                        std::string errorMessage = "Check Drivers Failed on " + it->name + " , driver will be removed. " + initName + " failed with ";
                        debug_trace_message(errorMessage, loader::to_string(result));
                    }
                    it = drivers->erase(it);
                    // If the number of drivers is now ==1, then we need to reinit the ddi tables to pass through.
                    // If ZE_ENABLE_LOADER_INTERCEPT is set to 1, then even if drivers were removed, don't reinit the ddi tables.
                    if (drivers->size() == 1 && !loader::context->forceIntercept) {
                        *requireDdiReinit = true;
                    }
                } else {
                    it++;
                }
                if(return_first_driver_result)
                    return result;
            } else {
                // If this is a single driver system, then the first success for this driver needs to be set.
                it->driverInuse = true;
                it++;
            }
        }

        if(drivers->size() == 0)
            return ZE_RESULT_ERROR_UNINITIALIZED;

        return ZE_RESULT_SUCCESS;
    }